

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::GrowNoAnnotate
          (RepeatedField<google::protobuf::UnknownField> *this,bool was_soo,int old_size,
          int new_size)

{
  uint uVar1;
  Arena *this_00;
  HeapRep *pHVar2;
  undefined8 *puVar3;
  UnknownField *__src;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_01;
  undefined7 in_register_00000031;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  string_view str;
  undefined1 auVar7 [16];
  int local_44;
  LogMessage local_40;
  
  iVar5 = 0;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar5 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar5 < new_size) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      this_00 = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      pHVar2 = heap_rep(this);
      this_00 = (pHVar2->field_0).arena;
    }
    if (new_size < 1) {
      uVar6 = 1;
    }
    else if (iVar5 < 0x3ffffff8) {
      if (iVar5 < 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x493,"capacity == 0 || capacity >= lower_limit");
        local_44 = iVar5;
        this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                            (&local_40,&local_44);
        str._M_str = " ";
        str._M_len = 1;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_01,str);
        local_44 = 1;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_01,&local_44);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      uVar1 = iVar5 * 2 + 1;
      if ((uint)new_size < uVar1) {
        new_size = uVar1;
      }
      uVar6 = (ulong)(uint)new_size;
    }
    else {
      uVar6 = 0x7fffffff;
    }
    if (this_00 == (Arena *)0x0) {
      uVar4 = uVar6 * 0x10 + 0x10;
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        puVar3 = (undefined8 *)operator_new(uVar4);
      }
      else {
        auVar7 = (**(code **)(in_FS_OFFSET + -0x48))(uVar4,*(undefined8 *)(in_FS_OFFSET + -0x40));
        puVar3 = auVar7._0_8_;
        uVar6 = auVar7._8_8_ - 0x10U >> 4;
      }
      uVar4 = 0x7fffffff;
      if (uVar6 < 0x7fffffff) {
        uVar4 = uVar6;
      }
    }
    else {
      puVar3 = (undefined8 *)Arena::AllocateForArray(this_00,uVar6 * 0x10 + 0x17 & 0xffffffff0);
      uVar4 = uVar6;
    }
    *puVar3 = this_00;
    if (0 < old_size) {
      __src = elements(this,was_soo);
      memcpy(puVar3 + 2,__src,(ulong)(uint)old_size << 4);
    }
    if (!was_soo) {
      InternalDeallocate<false>(this);
    }
    internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,(int)uVar4,puVar3 + 2);
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)new_size,(long)iVar5,"new_size > old_capacity");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x4ad,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}